

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_228fb::SetWriter::SetWriter(SetWriter *this)

{
  SetWriter *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__SetWriter_00232ba8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->bytes_);
  pstore::serialize::archive::vector_writer::vector_writer(&this->writer_,&this->bytes_);
  return;
}

Assistant:

SetWriter ()
                : writer_{bytes_} {}